

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void update_pub_insn(cs_insn *pub,InternalInstruction *inter,uint8_t *prefixes)

{
  x86_reg xVar1;
  uint8_t *prefixes_local;
  InternalInstruction *inter_local;
  cs_insn *pub_local;
  
  *prefixes = inter->prefix0;
  prefixes[1] = inter->prefix1;
  prefixes[2] = inter->prefix2;
  prefixes[3] = inter->prefix3;
  if (inter->vectorExtensionType == TYPE_NO_VEX_XOP) {
    if (inter->twoByteEscape == '\0') {
      (pub->detail->field_6).x86.opcode[0] = inter->opcode;
    }
    else if (inter->threeByteEscape == '\0') {
      (pub->detail->field_6).x86.opcode[0] = inter->twoByteEscape;
      (pub->detail->field_6).x86.opcode[1] = inter->opcode;
    }
    else {
      (pub->detail->field_6).x86.opcode[0] = inter->twoByteEscape;
      (pub->detail->field_6).x86.opcode[1] = inter->threeByteEscape;
      (pub->detail->field_6).x86.opcode[2] = inter->opcode;
    }
  }
  else {
    (pub->detail->field_6).arm.vector_size = *(int *)inter->vectorExtensionPrefix;
  }
  (pub->detail->field_6).x86.rex = inter->rexPrefix;
  (pub->detail->field_6).x86.addr_size = inter->addressSize;
  (pub->detail->field_6).x86.modrm = inter->orgModRM;
  (pub->detail->field_6).x86.sib = inter->sib;
  (pub->detail->field_6).x86.disp = inter->displacement;
  xVar1 = x86_map_sib_index(inter->sibIndex);
  (pub->detail->field_6).x86.sib_index = xVar1;
  (pub->detail->field_6).x86.sib_scale = inter->sibScale;
  xVar1 = x86_map_sib_base(inter->sibBase);
  (pub->detail->field_6).x86.sib_base = xVar1;
  return;
}

Assistant:

static void update_pub_insn(cs_insn *pub, InternalInstruction *inter, uint8_t *prefixes)
{
	prefixes[0] = inter->prefix0;
	prefixes[1] = inter->prefix1;
	prefixes[2] = inter->prefix2;
	prefixes[3] = inter->prefix3;

	if (inter->vectorExtensionType != 0)
		memcpy(pub->detail->x86.opcode, inter->vectorExtensionPrefix, sizeof(pub->detail->x86.opcode));
	else {
		if (inter->twoByteEscape) {
			if (inter->threeByteEscape) {
				pub->detail->x86.opcode[0] = inter->twoByteEscape;
				pub->detail->x86.opcode[1] = inter->threeByteEscape;
				pub->detail->x86.opcode[2] = inter->opcode;
			} else {
				pub->detail->x86.opcode[0] = inter->twoByteEscape;
				pub->detail->x86.opcode[1] = inter->opcode;
			}
		} else {
				pub->detail->x86.opcode[0] = inter->opcode;
		}
	}

	pub->detail->x86.rex = inter->rexPrefix;

	pub->detail->x86.addr_size = inter->addressSize;

	pub->detail->x86.modrm = inter->orgModRM;
	pub->detail->x86.sib = inter->sib;
	pub->detail->x86.disp = inter->displacement;

	pub->detail->x86.sib_index = x86_map_sib_index(inter->sibIndex);
	pub->detail->x86.sib_scale = inter->sibScale;
	pub->detail->x86.sib_base = x86_map_sib_base(inter->sibBase);
}